

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

Error * ot::commissioner::internal::DecodeRoute64
                  (Error *__return_storage_ptr__,Route64 *aRoute64,ByteArray *aBuf)

{
  pointer *ppRVar1;
  byte bVar2;
  pointer puVar3;
  iterator __position;
  undefined5 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  RouteDataEntry entry;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string *local_90;
  Error *local_88;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  ErrorCode local_58 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  local_90 = (string *)&__return_storage_ptr__->mMessage;
  local_60 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_60;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  puVar3 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  local_88 = __return_storage_ptr__;
  if (uVar7 < 9) {
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
    local_c8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "incorrect size of Route64";
    local_c8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x19;
    local_c8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_c8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_c8.parse_funcs_[0] = (parse_func)0x0;
    pcVar9 = "incorrect size of Route64";
    local_c8.context_.types_ = local_c8.types_;
    do {
      pcVar6 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar9,"",&local_c8);
      }
      pcVar9 = pcVar6;
    } while (pcVar6 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_c8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_80,(v10 *)"incorrect size of Route64",(string_view)ZEXT816(0x19),args);
    local_58[0] = kBadFormat;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    local_88->mCode = local_58[0];
    std::__cxx11::string::operator=(local_90,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    _Var10._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return local_88;
    }
  }
  else {
    aRoute64->mIdSequence = *puVar3;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar3 + 1),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar3 + 9),(allocator_type *)local_58);
    puVar3 = (aRoute64->mMask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (aRoute64->mMask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
    (aRoute64->mMask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_c8.context_.super_basic_format_parse_context<char>.format_str_.data_;
    (aRoute64->mMask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_c8.context_.super_basic_format_parse_context<char>.format_str_.size_;
    local_c8._0_8_ = (pointer)0x0;
    local_c8.context_.super_basic_format_parse_context<char>.format_str_.data_ = (char *)0x0;
    local_c8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0;
    if ((puVar3 != (pointer)0x0) &&
       (operator_delete(puVar3), (pointer)local_c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_c8._0_8_);
    }
    ExtractRouterIds((ByteArray *)&local_c8,&aRoute64->mMask);
    _Var10._M_p = (pointer)local_c8._0_8_;
    if (uVar7 - 9 ==
        (long)local_c8.context_.super_basic_format_parse_context<char>.format_str_.data_ -
        local_c8._0_8_) {
      if (uVar7 != 9) {
        lVar8 = 0;
        do {
          uVar4 = local_c8._3_5_;
          bVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8 + 9];
          local_c8.types_[0]._0_2_ = CONCAT11(bVar2 >> 6,_Var10._M_p[lVar8]);
          local_c8._0_8_ =
               CONCAT53(uVar4,CONCAT12(bVar2 >> 4,(undefined2)local_c8.types_[0])) &
               0xffffffff0003ffff;
          local_c8._0_8_ =
               CONCAT44(local_c8._4_4_,CONCAT13(bVar2,(undefined3)local_c8.types_[0])) &
               0xffffffff0fffffff;
          uVar5 = local_c8._0_8_;
          __position._M_current =
               (aRoute64->mRouteData).
               super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (aRoute64->mRouteData).
              super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<ot::commissioner::RouteDataEntry,std::allocator<ot::commissioner::RouteDataEntry>>
            ::_M_realloc_insert<ot::commissioner::RouteDataEntry&>
                      ((vector<ot::commissioner::RouteDataEntry,std::allocator<ot::commissioner::RouteDataEntry>>
                        *)&aRoute64->mRouteData,__position,(RouteDataEntry *)&local_c8);
          }
          else {
            (__position._M_current)->mRouterId = (undefined1)local_c8.types_[0];
            (__position._M_current)->mOutgoingLinkQuality = local_c8.types_[0]._1_1_;
            (__position._M_current)->mIncomingLinkQuality = local_c8.types_[0]._2_1_;
            (__position._M_current)->mRouteCost = local_c8.types_[0]._3_1_;
            ppRVar1 = &(aRoute64->mRouteData).
                       super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppRVar1 = *ppRVar1 + 1;
            local_c8._0_8_ = uVar5;
          }
          lVar8 = lVar8 + 1;
        } while (uVar7 - 9 != lVar8);
        goto LAB_001c7bb8;
      }
    }
    else {
      local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
      local_c8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "incorrect size of RouteData";
      local_c8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1b;
      local_c8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_c8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_c8.parse_funcs_[0] = (parse_func)0x0;
      pcVar9 = "incorrect size of RouteData";
      local_c8.context_.types_ = local_c8.types_;
      do {
        pcVar6 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar9,"",&local_c8);
        }
        pcVar9 = pcVar6;
      } while (pcVar6 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_c8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_80,(v10 *)"incorrect size of RouteData",(string_view)ZEXT816(0x1b),args_00);
      local_58[0] = kBadFormat;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      local_88->mCode = local_58[0];
      std::__cxx11::string::operator=(local_90,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
    }
    if ((pointer)_Var10._M_p == (pointer)0x0) {
      return local_88;
    }
  }
LAB_001c7bb8:
  operator_delete(_Var10._M_p);
  return local_88;
}

Assistant:

Error internal::DecodeRoute64(Route64 &aRoute64, const ByteArray &aBuf)
{
    Error     error;
    size_t    length = aBuf.size();
    size_t    offset = 0;
    ByteArray routerIdList;

    VerifyOrExit(length >= kRouterIdMaskBytes + 1, error = ERROR_BAD_FORMAT("incorrect size of Route64"));
    aRoute64.mIdSequence = aBuf[offset++];
    aRoute64.mMask       = {aBuf.begin() + offset, aBuf.begin() + offset + kRouterIdMaskBytes};
    offset += kRouterIdMaskBytes;

    routerIdList = ExtractRouterIds(aRoute64.mMask);
    VerifyOrExit((length - offset) == routerIdList.size(), error = ERROR_BAD_FORMAT("incorrect size of RouteData"));
    while (offset < length)
    {
        RouteDataEntry entry;
        entry.mRouterId = routerIdList[offset - kRouterIdMaskBytes - 1];
        DecodeRouteDataEntry(entry, aBuf[offset]);
        aRoute64.mRouteData.emplace_back(entry);
        offset++;
    }

exit:
    return error;
}